

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall btSimpleDynamicsWorld::updateAabbs(btSimpleDynamicsWorld *this)

{
  btCollisionObject *pbVar1;
  btBroadphaseInterface *pbVar2;
  int iVar3;
  long lVar4;
  btVector3 maxAabb;
  btVector3 minAabb;
  undefined1 auStack_48 [16];
  undefined1 local_38 [16];
  
  iVar3 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      pbVar1 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_data[lVar4]
      ;
      if ((((pbVar1 != (btCollisionObject *)0x0) && ((pbVar1->m_internalType & 2U) != 0)) &&
          (pbVar1->m_activationState1 != 2)) &&
         ((pbVar1->m_activationState1 != 5 && ((pbVar1->m_collisionFlags & 1) == 0)))) {
        (*pbVar1->m_collisionShape->_vptr_btCollisionShape[2])
                  (pbVar1->m_collisionShape,&pbVar1->m_worldTransform,local_38,auStack_48);
        pbVar2 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_broadphasePairCache;
        (*pbVar2->_vptr_btBroadphaseInterface[4])
                  (pbVar2,pbVar1->m_broadphaseHandle,local_38,auStack_48,
                   (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatcher1);
        iVar3 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE	int size() const
		{	
			return m_size;
		}